

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterConversion.h
# Opt level: O0

void PixelToaster::convert_XBGRFFFF_to_BGR888(Pixel *source,integer8 *destination,uint count)

{
  integer32 iVar1;
  integer32 iVar2;
  integer32 iVar3;
  integer32 b;
  integer32 g;
  integer32 r;
  uint i;
  uint count_local;
  integer8 *destination_local;
  Pixel *source_local;
  
  _i = destination;
  for (g = 0; g < count; g = g + 1) {
    iVar1 = clamped_fraction_8(source[g].r);
    iVar2 = clamped_fraction_8(source[g].g);
    iVar3 = clamped_fraction_8(source[g].b);
    *_i = (integer8)(iVar3 >> 0xf);
    _i[1] = (integer8)(iVar2 >> 0xf);
    _i[2] = (integer8)(iVar1 >> 0xf);
    _i = _i + 3;
  }
  return;
}

Assistant:

inline void convert_XBGRFFFF_to_BGR888(const Pixel source[], integer8 destination[], unsigned int count)
{
    for (unsigned int i = 0; i < count; ++i)
    {
        const integer32 r = clamped_fraction_8(source[i].r) >> 15;
        const integer32 g = clamped_fraction_8(source[i].g) >> 15;
        const integer32 b = clamped_fraction_8(source[i].b) >> 15;

        destination[0] = (integer8)b;
        destination[1] = (integer8)g;
        destination[2] = (integer8)r;

        destination += 3;
    }
}